

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_extensions.cpp
# Opt level: O0

char * ONX_ModelTest::ResultToString(Result result)

{
  char *pcStack_10;
  Result result_local;
  
  switch(result) {
  case Unset:
    pcStack_10 = "Unset";
    break;
  case Fail:
    pcStack_10 = "Fail";
    break;
  case Errors:
    pcStack_10 = "Errors";
    break;
  case Warnings:
    pcStack_10 = "Warnings";
    break;
  case Pass:
    pcStack_10 = "Pass";
    break;
  case Skip:
    pcStack_10 = "Skip";
    break;
  default:
    ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_extensions.cpp"
               ,0xfac,"","Invalid result parameter.");
    pcStack_10 = "Invalid result parameter";
  }
  return pcStack_10;
}

Assistant:

const char* ONX_ModelTest::ResultToString(ONX_ModelTest::Result result)
{
  switch (result)
  {
  case ONX_ModelTest::Result::Unset:
    return "Unset";
    break;
  case ONX_ModelTest::Result::Fail:
    return "Fail";
    break;
  case ONX_ModelTest::Result::Errors:
    return "Errors";
    break;
  case ONX_ModelTest::Result::Warnings:
    return "Warnings";
    break;
  case ONX_ModelTest::Result::Pass:
    return "Pass";
    break;
  case ONX_ModelTest::Result::Skip:
    return "Skip";
    break;
  default:
    break;
  }

  ON_ERROR("Invalid result parameter.");
  return "Invalid result parameter";
}